

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * ghc::filesystem::canonical(path *__return_storage_ptr__,path *p,error_code *ec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  const_iterator cVar3;
  impl_string_type *piVar4;
  size_type sVar5;
  undefined8 uVar6;
  error_code *peVar7;
  const_iterator cVar8;
  bool bVar9;
  int iVar10;
  error_category *peVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  format fVar14;
  ulong uVar16;
  time_t *lwt;
  int iVar17;
  path target;
  path pe;
  path work;
  file_status sls;
  file_status fs;
  path root;
  iterator __begin3;
  iterator __end3;
  path local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  path local_180;
  error_code *local_160;
  path local_158;
  uint local_134;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  path *local_128;
  path local_120;
  error_category *local_100;
  path local_f8;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  iterator local_b0;
  iterator local_70;
  _Alloc_hider _Var15;
  
  if ((p->_path)._M_string_length == 0) {
    peVar11 = (error_category *)std::_V2::system_category();
    ec->_M_value = 2;
    ec->_M_cat = peVar11;
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  local_160 = ec;
  bVar9 = path::has_root_directory(p);
  if (bVar9) {
    local_120._path._M_dataplus._M_p = (pointer)&local_120._path.field_2;
    pcVar2 = (p->_path)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,pcVar2,pcVar2 + (p->_path)._M_string_length);
  }
  else {
    absolute(&local_120,p,local_160);
  }
  path::root_path((path *)(local_d8 + 8),&local_120);
  peVar7 = local_160;
  local_158._path._M_dataplus._M_p = (pointer)((long)&local_158 + 0x10);
  local_158._path._M_string_length = 0;
  local_158._path.field_2._M_local_buf[0] = '\0';
  lwt = (time_t *)0x0;
  detail::status_ex((path *)local_d8,(error_code *)&local_120,(file_status *)local_160,
                    (uintmax_t *)0x0,(uintmax_t *)0x0,(time_t *)0x0,0);
  if (peVar7->_M_value == 0) {
    if (local_d8._0_4_ != 1) {
      local_130 = &(__return_storage_ptr__->_path).field_2;
      local_128 = __return_storage_ptr__;
      do {
        local_158._path._M_string_length = 0;
        *local_158._path._M_dataplus._M_p = '\0';
        local_70._first._M_current = local_120._path._M_dataplus._M_p;
        local_1c0._path._M_dataplus._M_p =
             local_120._path._M_string_length + local_120._path._M_dataplus._M_p;
        local_180._path._M_dataplus._M_p = local_120._path._M_dataplus._M_p;
        path::iterator::iterator
                  (&local_b0,&local_70._first,(const_iterator *)&local_1c0,
                   (const_iterator *)&local_180);
        local_1c0._path._M_dataplus._M_p = local_120._path._M_dataplus._M_p;
        local_1a0._M_allocated_capacity =
             (size_type)(local_120._path._M_dataplus._M_p + local_120._path._M_string_length);
        paVar12 = &local_1a0;
        local_180._path._M_dataplus._M_p = (pointer)local_1a0._M_allocated_capacity;
        path::iterator::iterator
                  (&local_70,(const_iterator *)&local_1c0,(const_iterator *)&local_180,
                   (const_iterator *)&paVar12->_M_allocated_capacity);
        local_134 = 0;
        while (cVar8._M_current = local_70._iter._M_current,
              cVar3._M_current = local_b0._iter._M_current,
              local_b0._iter._M_current != local_70._iter._M_current) {
          local_180._path._M_dataplus._M_p = (pointer)&local_180._path.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_180,local_b0._current._path._M_dataplus._M_p,
                     local_b0._current._path._M_dataplus._M_p +
                     local_b0._current._path._M_string_length);
          iVar17 = 5;
          if (local_180._path._M_string_length != 0) {
            local_1c0._path._M_dataplus._M_p = (pointer)&local_1c0._path.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,".","");
            local_1a0._M_allocated_capacity = (size_type)&local_190;
            _Var15._M_p = local_1c0._path._M_dataplus._M_p;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_1a0,local_1c0._path._M_dataplus._M_p,
                       (error_category *)
                       (local_1c0._path._M_string_length + (long)local_1c0._path._M_dataplus._M_p));
            fVar14 = (format)_Var15._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._path._M_dataplus._M_p != &local_1c0._path.field_2) {
              uVar16 = local_1c0._path.field_2._M_allocated_capacity + 1;
              operator_delete(local_1c0._path._M_dataplus._M_p,uVar16);
              fVar14 = (format)uVar16;
            }
            path::postprocess_path_with_format((impl_string_type *)&local_1a0,fVar14);
            uVar6 = local_1a0._M_allocated_capacity;
            if (local_180._path._M_string_length == local_1a0._8_8_) {
              if (local_180._path._M_string_length == 0) {
                bVar9 = true;
              }
              else {
                iVar10 = bcmp(local_180._path._M_dataplus._M_p,
                              (void *)local_1a0._M_allocated_capacity,
                              local_180._path._M_string_length);
                bVar9 = iVar10 == 0;
              }
            }
            else {
              bVar9 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)uVar6 != &local_190) {
              operator_delete((void *)uVar6,local_190._M_allocated_capacity + 1);
            }
            if (!bVar9) {
              local_1c0._path._M_dataplus._M_p = (pointer)&local_1c0._path.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"..","");
              local_1a0._M_allocated_capacity = (size_type)&local_190;
              _Var15._M_p = local_1c0._path._M_dataplus._M_p;
              std::__cxx11::string::
              _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ((string *)&local_1a0,local_1c0._path._M_dataplus._M_p,
                         (error_category *)
                         (local_1c0._path._M_string_length + (long)local_1c0._path._M_dataplus._M_p)
                        );
              fVar14 = (format)_Var15._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._path._M_dataplus._M_p != &local_1c0._path.field_2) {
                uVar16 = local_1c0._path.field_2._M_allocated_capacity + 1;
                operator_delete(local_1c0._path._M_dataplus._M_p,uVar16);
                fVar14 = (format)uVar16;
              }
              path::postprocess_path_with_format((impl_string_type *)&local_1a0,fVar14);
              uVar6 = local_1a0._M_allocated_capacity;
              if (local_180._path._M_string_length == local_1a0._8_8_) {
                if (local_180._path._M_string_length == 0) {
                  bVar9 = true;
                }
                else {
                  iVar10 = bcmp(local_180._path._M_dataplus._M_p,
                                (void *)local_1a0._M_allocated_capacity,
                                local_180._path._M_string_length);
                  bVar9 = iVar10 == 0;
                }
              }
              else {
                bVar9 = false;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)uVar6 != &local_190) {
                operator_delete((void *)uVar6,local_190._M_allocated_capacity + 1);
              }
              if (bVar9) {
                path::parent_path(&local_1c0,&local_158);
                std::__cxx11::string::operator=((string *)&local_158,(string *)&local_1c0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0._path._M_dataplus._M_p != &local_1c0._path.field_2) {
                  operator_delete(local_1c0._path._M_dataplus._M_p,
                                  local_1c0._path.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                operator/((path *)&local_1a0,&local_158,&local_180);
                paVar13 = &local_1c0._path.field_2;
                local_1c0._path._M_dataplus._M_p = (pointer)paVar13;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1c0,local_1a0._M_allocated_capacity,
                           local_1a0._8_8_ + local_1a0._M_allocated_capacity);
                sVar5 = local_1c0._path._M_string_length;
                paVar1 = &local_f8._path.field_2;
                local_f8._path._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_f8,local_d8._8_8_,
                           (char *)(local_d8._8_8_ + local_c8._M_allocated_capacity));
                local_100 = (error_category *)local_f8._path._M_string_length;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8._path._M_dataplus._M_p != paVar1) {
                  operator_delete(local_f8._path._M_dataplus._M_p,
                                  local_f8._path.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0._path._M_dataplus._M_p != paVar13) {
                  operator_delete(local_1c0._path._M_dataplus._M_p,
                                  local_1c0._path.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a0._M_allocated_capacity != &local_190) {
                  operator_delete((void *)local_1a0._M_allocated_capacity,
                                  local_190._M_allocated_capacity + 1);
                }
                if (local_100 < sVar5) {
                  operator/(&local_1c0,&local_158,&local_180);
                  peVar7 = local_160;
                  detail::symlink_status_ex
                            (&local_f8,(error_code *)&local_1c0,(uintmax_t *)local_160,
                             &paVar12->_M_allocated_capacity,lwt);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c0._path._M_dataplus._M_p != &local_1c0._path.field_2) {
                    operator_delete(local_1c0._path._M_dataplus._M_p,
                                    local_1c0._path.field_2._M_allocated_capacity + 1);
                  }
                  if (peVar7->_M_value == 0) {
                    if ((int)local_f8._path._M_dataplus._M_p == 4) {
                      operator/((path *)&local_1a0,&local_158,&local_180);
                      read_symlink(&local_1c0,(path *)&local_1a0,peVar7);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1a0._M_allocated_capacity != &local_190) {
                        operator_delete((void *)local_1a0._M_allocated_capacity,
                                        local_190._M_allocated_capacity + 1);
                      }
                      if (peVar7->_M_value == 0) {
                        bVar9 = path::has_root_directory(&local_1c0);
                        iVar17 = 5;
                        if (bVar9) {
                          std::__cxx11::string::_M_assign((string *)&local_158);
                        }
                        else {
                          path::operator/=(&local_158,&local_1c0);
                        }
                      }
                      else {
                        (local_128->_path)._M_dataplus._M_p = (pointer)local_130;
                        (local_128->_path)._M_string_length = 0;
                        (local_128->_path).field_2._M_local_buf[0] = '\0';
                        iVar17 = 1;
                        paVar12 = local_130;
                      }
                      paVar13 = &local_1c0._path.field_2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1c0._path._M_dataplus._M_p != paVar13) {
                        operator_delete(local_1c0._path._M_dataplus._M_p,
                                        local_1c0._path.field_2._M_allocated_capacity + 1);
                        paVar13 = extraout_RAX;
                      }
                      local_134 = (uint)CONCAT71((int7)((ulong)paVar13 >> 8),1);
                    }
                    else {
                      iVar17 = 0;
                      path::operator/=(&local_158,&local_180);
                    }
                  }
                  else {
                    (local_128->_path)._M_dataplus._M_p = (pointer)local_130;
                    (local_128->_path)._M_string_length = 0;
                    (local_128->_path).field_2._M_local_buf[0] = '\0';
                    iVar17 = 1;
                    paVar12 = local_130;
                  }
                }
                else {
                  path::operator/=(&local_158,&local_180);
                }
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._path._M_dataplus._M_p != &local_180._path.field_2) {
            operator_delete(local_180._path._M_dataplus._M_p,
                            local_180._path.field_2._M_allocated_capacity + 1);
          }
          if ((iVar17 != 5) && (iVar17 != 0)) break;
          path::iterator::operator++(&local_b0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._current._path._M_dataplus._M_p != &local_70._current._path.field_2) {
          operator_delete(local_70._current._path._M_dataplus._M_p,
                          local_70._current._path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._current._path._M_dataplus._M_p != &local_b0._current._path.field_2) {
          operator_delete(local_b0._current._path._M_dataplus._M_p,
                          local_b0._current._path.field_2._M_allocated_capacity + 1);
        }
        __return_storage_ptr__ = local_128;
        if (cVar3._M_current != cVar8._M_current) goto LAB_001562b1;
        std::__cxx11::string::_M_assign((string *)&local_120);
      } while ((local_134 & 1) != 0);
      peVar11 = (error_category *)std::_V2::system_category();
      local_160->_M_value = 0;
      local_160->_M_cat = peVar11;
      (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)local_130;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)&local_158 + 0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._path._M_dataplus._M_p == paVar12) {
        cVar3._M_current._1_7_ = local_158._path.field_2._M_allocated_capacity._1_7_;
        cVar3._M_current._0_1_ = local_158._path.field_2._M_local_buf[0];
        local_130->_M_allocated_capacity = (size_type)cVar3._M_current;
        ((const_iterator *)((long)local_130 + 8))->_M_current =
             (char *)local_158._path.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_path)._M_dataplus._M_p = local_158._path._M_dataplus._M_p;
        (__return_storage_ptr__->_path).field_2._M_allocated_capacity =
             CONCAT71(local_158._path.field_2._M_allocated_capacity._1_7_,
                      local_158._path.field_2._M_local_buf[0]);
      }
      piVar4 = &local_158._path;
      (__return_storage_ptr__->_path)._M_string_length = local_158._path._M_string_length;
      local_158._path._M_dataplus._M_p = (pointer)paVar12;
      goto LAB_001562a7;
    }
    peVar11 = (error_category *)std::_V2::system_category();
    local_160->_M_value = 2;
    local_160->_M_cat = peVar11;
  }
  paVar12 = &(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar12;
  piVar4 = &__return_storage_ptr__->_path;
LAB_001562a7:
  piVar4->_M_string_length = 0;
  paVar12->_M_local_buf[0] = '\0';
LAB_001562b1:
  if (local_158._path._M_dataplus._M_p != (pointer)((long)&local_158 + 0x10)) {
    operator_delete(local_158._path._M_dataplus._M_p,
                    CONCAT71(local_158._path.field_2._M_allocated_capacity._1_7_,
                             local_158._path.field_2._M_local_buf[0]) + 1);
  }
  if ((char *)local_d8._8_8_ != local_c8._M_local_buf + 8) {
    operator_delete((void *)local_d8._8_8_,local_c8._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._path._M_dataplus._M_p != &local_120._path.field_2) {
    operator_delete(local_120._path._M_dataplus._M_p,
                    local_120._path.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path canonical(const path& p, std::error_code& ec)
{
    if (p.empty()) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    path work = p.is_absolute() ? p : absolute(p, ec);
    path root = work.root_path();
    path result;

    auto fs = status(work, ec);
    if (ec) {
        return path();
    }
    if (fs.type() == file_type::not_found) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    bool redo;
    do {
        redo = false;
        result.clear();
        for (auto pe : work) {
            if (pe.empty() || pe == ".") {
                continue;
            }
            else if (pe == "..") {
                result = result.parent_path();
                continue;
            }
            else if ((result / pe).string().length() <= root.string().length()) {
                result /= pe;
                continue;
            }
            auto sls = symlink_status(result / pe, ec);
            if (ec) {
                return path();
            }
            if (is_symlink(sls)) {
                redo = true;
                auto target = read_symlink(result / pe, ec);
                if (ec) {
                    return path();
                }
                if (target.is_absolute()) {
                    result = target;
                    continue;
                }
                else {
                    result /= target;
                    continue;
                }
            }
            else {
                result /= pe;
            }
        }
        work = result;
    } while (redo);
    ec.clear();
    return result;
}